

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O0

int dopickup(void)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  int local_1c;
  trap *ptStack_18;
  int tmpcount;
  trap *traphere;
  int count;
  
  ptStack_18 = t_at(level,(int)u.ux,(int)u.uy);
  local_1c = multi;
  traphere._0_4_ = multi;
  multi = 0;
  if ((u._1052_1_ & 1) != 0) {
    if ((u.ustuck)->minvent == (obj *)0x0) {
      if (((u.ustuck)->data->mflags1 & 0x40000) == 0) {
        if ((u.uprops[0x1e].intrinsic != 0) ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (bVar4 = false, ((youmonst.data)->mflags1 & 0x1000) != 0)))) {
          bVar4 = false;
          if (ublindf != (obj *)0x0) {
            bVar4 = ublindf->oartifact == '\x1d';
          }
          bVar4 = (bool)(bVar4 ^ 1);
        }
        pcVar3 = "not see";
        if (bVar4) {
          pcVar3 = "You feel";
        }
        pline("You don\'t %s anything in here to pick up.",pcVar3 + 4);
      }
      else {
        pcVar3 = mon_nam(u.ustuck);
        pcVar3 = s_suffix(pcVar3);
        pline("You pick up %s tongue.",pcVar3);
        pline("But it\'s kind of slimy, so you drop it.");
      }
      return 1;
    }
    local_1c = -local_1c;
    iVar2 = loot_mon(u.ustuck,&local_1c,(boolean *)0x0);
    return iVar2;
  }
  bVar1 = is_pool(level,(int)u.ux,(int)u.uy);
  if (bVar1 != '\0') {
    if ((((u.uprops[0x27].extrinsic != 0) &&
         (bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar1 == '\0')) ||
        (((youmonst.data)->mlet == '\x05' || (((youmonst.data)->mflags1 & 0x10) != 0)))) ||
       ((((u.uprops[0x3c].extrinsic != 0 || (((youmonst.data)->mflags1 & 1) != 0)) ||
         ((u.usteed != (monst *)0x0 && (((u.usteed)->data->mflags1 & 1) != 0)))) &&
        (((u.uprops[0x31].intrinsic == 0 && (u.uprops[0x31].extrinsic == 0)) &&
         (((youmonst.data)->mflags1 & 0x400) == 0)))))) {
      pline("You cannot dive into the water to pick things up.");
      return 0;
    }
    if (((byte)u._1052_1_ >> 1 & 1) == 0) {
      pline("You can\'t even see the bottom, let alone pick up something.");
      return 0;
    }
  }
  bVar1 = is_lava(level,(int)u.ux,(int)u.uy);
  if (bVar1 != '\0') {
    if ((((u.uprops[0x27].extrinsic != 0) &&
         (bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar1 == '\0')) ||
        (((youmonst.data)->mlet == '\x05' || (((youmonst.data)->mflags1 & 0x10) != 0)))) ||
       ((((u.uprops[0x3c].extrinsic != 0 || (((youmonst.data)->mflags1 & 1) != 0)) ||
         ((u.usteed != (monst *)0x0 && (((u.usteed)->data->mflags1 & 1) != 0)))) &&
        (((u.uprops[0x31].intrinsic == 0 && (u.uprops[0x31].extrinsic == 0)) &&
         (((youmonst.data)->mflags1 & 0x400) == 0)))))) {
      pline("You can\'t reach the bottom to pick things up.");
      return 0;
    }
    if ((youmonst.data != mons + 0xa0) && (youmonst.data != mons + 0x157)) {
      pline("You would burn to a crisp trying to pick things up.");
      return 0;
    }
  }
  if (level->objects[u.ux][u.uy] == (obj *)0x0) {
    if (level->locations[u.ux][u.uy].typ == '\x1e') {
      pline("The magic chest is firmly attached to the floor.");
    }
    else {
      pline("There is nothing here to pick up.");
    }
    traphere._4_4_ = 0;
  }
  else {
    bVar1 = can_reach_floor();
    if (bVar1 == '\0') {
      if ((u.usteed == (monst *)0x0) || ('\x01' < u.weapon_skills[0x27].skill)) {
        pcVar3 = surface((int)u.ux,(int)u.uy);
        pline("You cannot reach the %s.",pcVar3);
      }
      else {
        pcVar3 = y_monnam(u.usteed);
        pline("You aren\'t skilled enough to reach from %s.",pcVar3);
      }
      traphere._4_4_ = 0;
    }
    else if ((((ptStack_18 == (trap *)0x0) || (((byte)ptStack_18->field_0x8 >> 5 & 1) == 0)) ||
             (((ptStack_18->field_0x8 & 0x1f) != 0xb && ((ptStack_18->field_0x8 & 0x1f) != 0xc))))
            || ((u.utrap != 0 && ((u.utrap == 0 || (u.utraptype == 1)))))) {
      traphere._4_4_ = pickup(-(int)traphere);
    }
    else {
      pline("You cannot reach the bottom of the pit.");
      traphere._4_4_ = 0;
    }
  }
  return traphere._4_4_;
}

Assistant:

int dopickup(void)
{
	int count;
	struct trap *traphere = t_at(level, u.ux, u.uy);
 	/* awful kludge to work around parse()'s pre-decrement */
	count = multi;
	multi = 0;	/* always reset */
	/* uswallow case added by GAN 01/29/87 */
	if (u.uswallow) {
	    if (!u.ustuck->minvent) {
		if (is_animal(u.ustuck->data)) {
		    pline("You pick up %s tongue.", s_suffix(mon_nam(u.ustuck)));
		    pline("But it's kind of slimy, so you drop it.");
		} else
		    pline("You don't %s anything in here to pick up.",
			  Blind ? "feel" : "see");
		return 1;
	    } else {
	    	int tmpcount = -count;
		return loot_mon(u.ustuck, &tmpcount, NULL);
	    }
	}
	if (is_pool(level, u.ux, u.uy)) {
	    if (Wwalking || is_floater(youmonst.data) || is_clinger(youmonst.data)
			|| (Flying && !Breathless)) {
		pline("You cannot dive into the water to pick things up.");
		return 0;
	    } else if (!Underwater) {
		pline("You can't even see the bottom, let alone pick up something.");
		return 0;
	    }
	}
	if (is_lava(level, u.ux, u.uy)) {
	    if (Wwalking || is_floater(youmonst.data) || is_clinger(youmonst.data)
			|| (Flying && !Breathless)) {
		pline("You can't reach the bottom to pick things up.");
		return 0;
	    } else if (!likes_lava(youmonst.data)) {
		pline("You would burn to a crisp trying to pick things up.");
		return 0;
	    }
	}
	if (!OBJ_AT(u.ux, u.uy)) {
	    if (IS_MAGIC_CHEST(level->locations[u.ux][u.uy].typ))
		pline("The magic chest is firmly attached to the floor.");
	    else
		pline("There is nothing here to pick up.");
	    return 0;
	}
	if (!can_reach_floor()) {
		if (u.usteed && P_SKILL(P_RIDING) < P_BASIC)
		    pline("You aren't skilled enough to reach from %s.",
			y_monnam(u.usteed));
		else
			pline("You cannot reach the %s.", surface(u.ux,u.uy));
		return 0;
	}

 	if (traphere && traphere->tseen) {
		/* Allow pickup from holes and trap doors that you escaped from
		 * because that stuff is teetering on the edge just like you, but
		 * not pits, because there is an elevation discrepancy with stuff
		 * in pits.
		 */
		if ((traphere->ttyp == PIT || traphere->ttyp == SPIKED_PIT) &&
		     (!u.utrap || (u.utrap && u.utraptype != TT_PIT))) {
			pline("You cannot reach the bottom of the pit.");
			return 0;
		}
	}

	return pickup(-count);
}